

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

uchar * rlReadScreenPixels(int width,int height)

{
  void *__ptr;
  uchar *puVar1;
  int local_28;
  int local_24;
  int x;
  int y;
  uchar *imgData;
  uchar *screenData;
  int height_local;
  int width_local;
  
  __ptr = calloc((long)(width * height * 4),1);
  (*glad_glReadPixels)(0,0,width,height,0x1908,0x1401,__ptr);
  puVar1 = (uchar *)malloc((long)(width * height * 4));
  for (local_24 = height + -1; -1 < local_24; local_24 = local_24 + -1) {
    for (local_28 = 0; local_28 < width * 4; local_28 = local_28 + 1) {
      puVar1[((height + -1) - local_24) * width * 4 + local_28] =
           *(uchar *)((long)__ptr + (long)(local_24 * width * 4 + local_28));
      if ((local_28 + 1) % 4 == 0) {
        puVar1[((height + -1) - local_24) * width * 4 + local_28] = 0xff;
      }
    }
  }
  free(__ptr);
  return puVar1;
}

Assistant:

unsigned char *rlReadScreenPixels(int width, int height)
{
    unsigned char *screenData = (unsigned char *)RL_CALLOC(width*height*4, sizeof(unsigned char));

    // NOTE 1: glReadPixels returns image flipped vertically -> (0,0) is the bottom left corner of the framebuffer
    // NOTE 2: We are getting alpha channel! Be careful, it can be transparent if not cleared properly!
    glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, screenData);

    // Flip image vertically!
    unsigned char *imgData = (unsigned char *)RL_MALLOC(width*height*4*sizeof(unsigned char));

    for (int y = height - 1; y >= 0; y--)
    {
        for (int x = 0; x < (width*4); x++)
        {
            imgData[((height - 1) - y)*width*4 + x] = screenData[(y*width*4) + x];  // Flip line

            // Set alpha component value to 255 (no trasparent image retrieval)
            // NOTE: Alpha value has already been applied to RGB in framebuffer, we don't need it!
            if (((x + 1)%4) == 0) imgData[((height - 1) - y)*width*4 + x] = 255;
        }
    }

    RL_FREE(screenData);

    return imgData;     // NOTE: image data should be freed
}